

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_lda_xc_cam_lda0.c
# Opt level: O0

void xc_hyb_lda_xc_cam_lda0_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  double beta_00;
  double beta;
  double alpha;
  double exxlr;
  double exxglobal;
  double omega;
  double funcs_coef [3];
  double *in_stack_ffffffffffffffa8;
  double *ext_params;
  xc_func_type *p_00;
  
  p_00 = (xc_func_type *)0x3fe0000000000000;
  ext_params = (double *)0x3fe0000000000000;
  beta_00 = -0.25;
  xc_mix_init((xc_func_type *)0x3fe0000000000000,0x3fe00000,(int *)0xbfd0000000000000,
              in_stack_ffffffffffffffa8);
  xc_func_set_ext_params(p_00,ext_params);
  xc_hyb_init_cam(in_RDI,(double)ext_params,beta_00,0.3333333333333333);
  return;
}

Assistant:

void
xc_hyb_lda_xc_cam_lda0_init(xc_func_type *p)
{
  static int funcs_id[3] = {XC_LDA_X, XC_LDA_X_ERF, XC_LDA_C_PW_MOD};
  double funcs_coef[3];
  double omega, exxglobal, exxlr;
  double alpha, beta;

  /* omega = 1/3 */
  omega = 1.0/3.0;
  /* 1/4 global exact exchange */
  exxglobal = 1.0/4.0;
  /* 1/2 long-range exact exchange */
  exxlr = 1.0/2.0;

  /* Convert to libxc parameters */
  alpha = exxlr;
  beta = exxglobal-exxlr;

  /* Calculate mixing coefficients: full LDA */
  funcs_coef[0] = 1.0 - alpha;
  funcs_coef[1] = -beta;
  funcs_coef[2] = 1.0;

  /* Initialize functional */
  xc_mix_init(p, 3, funcs_id, funcs_coef);

  /* Set parameters */
  xc_func_set_ext_params(p->func_aux[1], &omega);

  xc_hyb_init_cam(p, alpha, beta, omega);
}